

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cc
# Opt level: O3

int CBS_get_ucs2_be(CBS *cbs,uint32_t *out)

{
  int iVar1;
  int iVar2;
  uint16_t c;
  ushort local_a;
  
  iVar1 = CBS_get_u16(cbs,&local_a);
  iVar2 = 0;
  if (iVar1 != 0) {
    if ((((local_a & 0xf800) != 0xd800) && (0x1f < local_a - 0xfdd0)) &&
       (iVar2 = 0, (local_a & 0xfffe) != 0xfffe)) {
      *out = (uint)local_a;
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int CBS_get_ucs2_be(CBS *cbs, uint32_t *out) {
  // Note UCS-2 (used by BMPString) does not support surrogates.
  uint16_t c;
  if (!CBS_get_u16(cbs, &c) ||
      !is_valid_code_point(c)) {
    return 0;
  }
  *out = c;
  return 1;
}